

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TestConfig::ParseFromArray(TestConfig *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  uint *in_R11;
  uint *puVar16;
  uint *puVar17;
  bool bVar18;
  uint *local_68;
  Field local_60;
  uint *local_50;
  TestConfig *local_48;
  uint *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (uint *)(size + (long)raw);
  do {
    lVar7 = 7;
    if (puVar9 <= raw) goto LAB_00245ea1;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar16 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar5 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar8 = puVar16;
      for (lVar6 = lVar7;
          (puVar13 = puVar8, uVar12 = uVar5, (char)bVar1 < '\0' &&
          (bVar18 = 0x38 < lVar6 - 7U, bVar10 = bVar18 || puVar9 <= puVar8, puVar13 = puVar16,
          uVar12 = 0, !bVar18 && puVar9 > puVar8)); lVar6 = lVar6 + 7) {
        bVar1 = (byte)*puVar8;
        in_R11 = (uint *)((ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f));
        puVar8 = (uint *)((long)puVar8 + 1);
        uVar5 = uVar5 | (ulong)in_R11;
      }
      puVar16 = puVar13;
      if (bVar10) {
        puVar16 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar16 == (uint *)raw) goto LAB_00245ea1;
    }
    uVar4 = (uint)(uVar12 >> 3);
    if ((uVar4 == 0) || (puVar9 <= puVar16)) {
switchD_00245d1e_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_60.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar16 >= puVar9;
        if (puVar16 < puVar9) {
          in_R11 = (uint *)((long)puVar16 + 1);
          puVar8 = (uint *)(ulong)((byte)*puVar16 & 0x7f);
          puVar13 = puVar8;
          uVar15 = 0;
          if ((char)(byte)*puVar16 < '\0') {
            puVar13 = (uint *)0x0;
            uVar15 = 0;
            lVar7 = 7;
            puVar17 = in_R11;
            do {
              bVar18 = 0x38 < lVar7 - 7U;
              bVar10 = bVar18 || puVar9 <= puVar17;
              if (bVar18 || puVar9 <= puVar17) goto LAB_00245ea7;
              uVar2 = *puVar17;
              puVar17 = (uint *)((long)puVar17 + 1);
              puVar8 = (uint *)((ulong)puVar8 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar7 & 0x3f))
              ;
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar2 < '\0');
            puVar13 = (uint *)((ulong)puVar8 & 0xffffffff);
            in_R11 = puVar17;
            uVar15 = (uint)((ulong)puVar8 >> 0x20);
          }
        }
        else {
          puVar13 = (uint *)0x0;
          uVar15 = 0;
        }
LAB_00245ea7:
        puVar8 = (uint *)(ulong)uVar15;
        if (bVar10) {
          in_R11 = puVar16;
          puVar8 = puVar11;
          puVar13 = puVar11;
        }
        local_68 = puVar16;
        local_40 = (uint *)raw;
        if (in_R11 != puVar16) goto LAB_00245ece;
        uVar12 = 0;
        bVar10 = false;
        local_60.int_value_ = (uint64_t)puVar11;
        goto LAB_00245f10;
      case 1:
        in_R11 = puVar16 + 2;
        if (puVar9 < in_R11) {
LAB_00245ea1:
          uVar12 = 0;
          bVar10 = false;
          local_60.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_00245f10;
        }
        puVar13 = *(uint **)puVar16;
        puVar8 = (uint *)((ulong)puVar13 >> 0x20);
        break;
      case 2:
        bVar10 = puVar16 >= puVar9;
        puVar8 = local_50;
        if (puVar16 < puVar9) {
          bVar1 = (byte)*puVar16;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar13 = (uint *)((long)puVar16 + 1U);
          for (; (in_R11 = puVar13, puVar8 = puVar11, (char)bVar1 < '\0' &&
                 (bVar18 = 0x38 < lVar7 - 7U, bVar10 = bVar18 || puVar9 <= puVar13,
                 in_R11 = (uint *)((long)puVar16 + 1U), puVar8 = local_50,
                 !bVar18 && puVar9 > puVar13)); lVar7 = lVar7 + 7) {
            bVar1 = (byte)*puVar13;
            puVar13 = (uint *)((long)puVar13 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
          }
        }
        local_50 = puVar8;
        if (bVar10) {
          in_R11 = puVar16;
          local_50 = (uint *)0x0;
        }
        if ((in_R11 == puVar16) || ((uint *)((long)puVar9 - (long)in_R11) < local_50)) {
          puVar8 = (uint *)0x0;
          puVar13 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar8 = (uint *)((ulong)in_R11 >> 0x20);
          puVar13 = (uint *)((ulong)in_R11 & 0xffffffff);
          in_R11 = (uint *)((long)in_R11 + (long)local_50);
          bVar10 = true;
          puVar11 = local_50;
        }
        local_68 = puVar16;
        if (!bVar10) goto LAB_00245ea1;
        goto LAB_00245ece;
      default:
        goto switchD_00245d1e_caseD_3;
      case 5:
        in_R11 = puVar16 + 1;
        puVar8 = (uint *)0x0;
        if (puVar9 < in_R11) goto LAB_00245ea1;
        puVar13 = (uint *)(ulong)*puVar16;
      }
      puVar11 = (uint *)0x0;
LAB_00245ece:
      bVar10 = true;
      raw = in_R11;
      if ((uVar4 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_60.int_value_ = (ulong)puVar13 & 0xffffffff | (long)puVar8 << 0x20;
        uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_60.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_00245f10:
    puVar16 = &switchD_00245d1e::switchdataD_0034df14;
    if (!bVar10) {
      local_60.size_ = (uint32_t)uVar12;
      local_60.type_ = (uint8_t)(uVar12 >> 0x30);
      local_60.id_ = (uint16_t)(uVar12 >> 0x20);
      local_48 = this;
      do {
        if (local_60.id_ == 0) {
          return puVar9 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 7) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar4 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar4 < 6) {
          uVar3 = (*(code *)(&DAT_0034df2c + *(int *)(&DAT_0034df2c + (ulong)uVar4 * 4)))();
          return (bool)uVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_60,local_38);
        do {
          if (puVar9 <= raw) goto LAB_00246332;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar8 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar5;
            puVar13 = puVar8;
            if ((char)(byte)*raw < '\0') {
              lVar7 = 7;
              puVar11 = puVar8;
              do {
                bVar10 = 0x38 < lVar7 - 7U || puVar9 <= puVar11;
                uVar12 = 0;
                puVar13 = puVar8;
                if (bVar10) break;
                uVar4 = *puVar11;
                puVar13 = (uint *)((long)puVar11 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f);
                lVar7 = lVar7 + 7;
                uVar12 = uVar5;
                puVar11 = puVar13;
              } while ((char)(byte)uVar4 < '\0');
            }
            puVar8 = puVar13;
            if (bVar10) {
              puVar8 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar8 == (uint *)raw) goto LAB_00246332;
          }
          uVar4 = (uint)(uVar12 >> 3);
          if ((uVar4 == 0) || (puVar9 <= puVar8)) {
switchD_0024617e_caseD_3:
            bVar10 = false;
            uVar12 = 0;
            local_60.int_value_ = (uint64_t)(uint *)0x0;
          }
          else {
            switch((uint)uVar12 & 7) {
            case 0:
              puVar17 = (uint *)0x0;
              bVar10 = puVar8 >= puVar9;
              if (puVar8 < puVar9) {
                puVar13 = (uint *)((long)puVar8 + 1);
                uVar15 = (byte)*puVar8 & 0x7f;
                uVar5 = (ulong)uVar15;
                puVar11 = (uint *)(ulong)uVar15;
                puVar16 = puVar13;
                uVar15 = 0;
                if ((char)(byte)*puVar8 < '\0') {
                  puVar11 = (uint *)0x0;
                  lVar7 = 7;
                  puVar14 = puVar13;
                  do {
                    bVar18 = 0x38 < lVar7 - 7U;
                    bVar10 = bVar18 || puVar9 <= puVar14;
                    puVar16 = puVar13;
                    uVar15 = 0;
                    if (bVar18 || puVar9 <= puVar14) break;
                    bVar1 = (byte)*puVar14;
                    puVar14 = (uint *)((long)puVar14 + 1);
                    uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                    lVar7 = lVar7 + 7;
                    if (-1 < (char)bVar1) {
                      puVar11 = (uint *)(uVar5 & 0xffffffff);
                    }
                    puVar16 = puVar14;
                    uVar15 = (uint)(uVar5 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar11 = (uint *)0x0;
                uVar15 = 0;
              }
              if (bVar10) {
                puVar11 = puVar17;
              }
              puVar13 = (uint *)(ulong)uVar15;
              if (bVar10) {
                puVar16 = puVar8;
                puVar13 = puVar17;
              }
              this = local_48;
              local_50 = puVar8;
              local_40 = (uint *)raw;
              if (puVar16 != puVar8) goto LAB_0024635b;
              uVar12 = 0;
              bVar10 = false;
              local_60.int_value_ = (uint64_t)puVar17;
              goto LAB_002463a6;
            case 1:
              puVar16 = puVar8 + 2;
              if (puVar9 < puVar16) {
LAB_00246332:
                uVar12 = 0;
                bVar10 = false;
                local_60.int_value_ = (uint64_t)(uint *)0x0;
                goto LAB_002463a6;
              }
              puVar11 = *(uint **)puVar8;
              puVar13 = (uint *)((ulong)puVar11 >> 0x20);
              break;
            case 2:
              bVar10 = puVar8 >= puVar9;
              puVar13 = local_68;
              if (puVar8 < puVar9) {
                puVar11 = (uint *)((long)puVar8 + 1);
                puVar17 = (uint *)(ulong)((byte)*puVar8 & 0x7f);
                puVar16 = puVar11;
                puVar13 = puVar17;
                if ((char)(byte)*puVar8 < '\0') {
                  lVar7 = 7;
                  puVar14 = puVar11;
                  do {
                    bVar10 = 0x38 < lVar7 - 7U || puVar9 <= puVar14;
                    puVar16 = puVar11;
                    puVar13 = local_68;
                    if (bVar10) break;
                    uVar15 = *puVar14;
                    puVar14 = (uint *)((long)puVar14 + 1);
                    puVar17 = (uint *)((ulong)puVar17 |
                                      (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar7 & 0x3f));
                    lVar7 = lVar7 + 7;
                    puVar16 = puVar14;
                    puVar13 = puVar17;
                  } while ((char)(byte)uVar15 < '\0');
                }
              }
              local_68 = puVar13;
              puVar11 = (uint *)0x0;
              if (bVar10) {
                puVar16 = puVar8;
                local_68 = puVar11;
              }
              if (puVar16 == puVar8) {
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar17 = (uint *)0x0;
              }
              else if ((uint *)((long)puVar9 - (long)puVar16) < local_68) {
                puVar11 = (uint *)0x0;
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar17 = (uint *)0x0;
              }
              else {
                puVar13 = (uint *)((ulong)puVar16 >> 0x20);
                puVar11 = (uint *)((ulong)puVar16 & 0xffffffff);
                puVar16 = (uint *)((long)puVar16 + (long)local_68);
                bVar10 = true;
                puVar17 = local_68;
              }
              this = local_48;
              if (!bVar10) goto LAB_00246332;
              goto LAB_0024635b;
            default:
              goto switchD_0024617e_caseD_3;
            case 5:
              puVar16 = puVar8 + 1;
              puVar13 = (uint *)0x0;
              if (puVar9 < puVar16) goto LAB_00246332;
              puVar11 = (uint *)(ulong)*puVar8;
            }
            puVar17 = (uint *)0x0;
LAB_0024635b:
            bVar10 = true;
            raw = puVar16;
            if ((uVar4 < 0x10000) && (puVar17 < (uint *)0x10000000)) {
              local_60.int_value_ = (ulong)puVar11 & 0xffffffff | (long)puVar13 << 0x20;
              uVar12 = (ulong)puVar17 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
              bVar10 = false;
            }
            else {
              local_60.int_value_ = 0;
              uVar12 = 0;
            }
          }
LAB_002463a6:
        } while (bVar10);
        local_60.size_ = (uint32_t)uVar12;
        local_60.type_ = (uint8_t)(uVar12 >> 0x30);
        local_60.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool TestConfig::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* message_count */:
        field.get(&message_count_);
        break;
      case 2 /* max_messages_per_second */:
        field.get(&max_messages_per_second_);
        break;
      case 3 /* seed */:
        field.get(&seed_);
        break;
      case 4 /* message_size */:
        field.get(&message_size_);
        break;
      case 5 /* send_batch_on_register */:
        field.get(&send_batch_on_register_);
        break;
      case 6 /* dummy_fields */:
        (*dummy_fields_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}